

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,HighsInt *iRow)

{
  HVectorBase<double> **ppHVar1;
  double *__args;
  double dVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  bool bVar9;
  HVectorBase<double> *pHVar10;
  void *pvVar11;
  void *pvVar12;
  undefined4 *puVar13;
  pointer pdVar14;
  ulong uVar15;
  pointer piVar16;
  pointer piVar17;
  undefined1 *puVar18;
  pointer piVar19;
  pointer piVar20;
  int iVar21;
  long lVar22;
  size_t sVar23;
  uint uVar24;
  int iVar25;
  void *pvVar26;
  undefined1 *puVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  HighsInt HVar31;
  long lVar32;
  vector<double,_std::allocator<double>_> *pvVar33;
  int *piVar34;
  vector<int,std::allocator<int>> *pvVar35;
  size_type __new_size;
  long lVar36;
  HighsInt *pHVar37;
  HighsInt index;
  HighsInt index_1;
  HighsInt u_endX;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  pair<int,_int> local_148;
  int local_13c;
  double local_138;
  undefined8 uStack_130;
  vector<int,std::allocator<int>> *local_128;
  HighsInt *local_120;
  vector<int,std::allocator<int>> *local_118;
  vector<double,_std::allocator<double>_> *local_110;
  vector<double,std::allocator<double>> *local_108;
  int local_fc;
  double local_f8;
  undefined8 uStack_f0;
  void *local_e8;
  vector<int,std::allocator<int>> *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  void *local_d0;
  undefined4 *local_c8;
  undefined1 *local_c0;
  void *local_b8;
  void *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  undefined1 *local_a0;
  pair<int,_int> *local_98;
  iterator iStack_90;
  pair<int,_int> *local_88;
  vector<int,std::allocator<int>> *local_78;
  ulong local_70;
  vector<int,std::allocator<int>> *local_68;
  double local_60;
  void *local_58;
  int local_4c;
  void *local_48;
  vector<double,std::allocator<double>> *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  uVar24 = 0;
  pHVar10 = aq;
  if (aq != (HVector *)0x0) {
    do {
      uVar24 = uVar24 + 1;
      ppHVar1 = &pHVar10->next;
      pHVar10 = *ppHVar1;
    } while (*ppHVar1 != (HVectorBase<double> *)0x0);
  }
  puVar27 = (undefined1 *)(ulong)uVar24;
  dVar2 = (double)((long)puVar27 * 8);
  local_120 = iRow;
  local_e8 = operator_new__((ulong)dVar2);
  local_138 = dVar2;
  local_58 = operator_new__((ulong)dVar2);
  pvVar26 = local_e8;
  if (uVar24 != 0) {
    puVar18 = (undefined1 *)0x0;
    do {
      *(HVector **)((long)local_e8 + (long)puVar18 * 8) = aq;
      *(HVector **)((long)local_58 + (long)puVar18 * 8) = ep;
      aq = aq->next;
      ep = ep->next;
      puVar18 = puVar18 + 1;
    } while (puVar27 != puVar18);
  }
  local_f8 = (double)((long)(this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  pvVar11 = operator_new__((long)puVar27 * 4);
  dVar2 = local_138;
  pvVar12 = operator_new__((ulong)local_138);
  local_48 = operator_new__((ulong)dVar2);
  if (puVar27 != (undefined1 *)0x0) {
    piVar17 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar18 = (undefined1 *)0x0;
    do {
      iVar21 = local_120[(long)puVar18];
      iVar30 = piVar17[iVar21];
      *(int *)((long)pvVar11 + (long)puVar18 * 4) = iVar30;
      *(double *)((long)pvVar12 + (long)puVar18 * 8) = pdVar14[iVar30];
      *(undefined8 *)((long)local_48 + (long)puVar18 * 8) =
           *(undefined8 *)
            (*(long *)(*(long *)((long)pvVar26 + (long)puVar18 * 8) + 0x20) + (long)iVar21 * 8);
      puVar18 = puVar18 + 1;
    } while (puVar27 != puVar18);
  }
  local_b8 = pvVar12;
  puVar13 = (undefined4 *)operator_new__((long)puVar27 * 4 + 4);
  local_d0 = operator_new__((ulong)local_138);
  local_70 = (ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  *puVar13 = (int)local_70;
  local_98 = (pair<int,_int> *)0x0;
  iStack_90._M_current = (pair<int,_int> *)0x0;
  local_88 = (pair<int,_int> *)0x0;
  local_c8 = puVar13;
  if (puVar27 != (undefined1 *)0x0) {
    local_78 = (vector<int,std::allocator<int>> *)&this->pf_pivot_index;
    local_128 = (vector<int,std::allocator<int>> *)&this->u_index;
    local_118 = (vector<int,std::allocator<int>> *)&this->iwork;
    local_d8 = &this->pf_start;
    local_e0 = (vector<int,std::allocator<int>> *)&this->pf_index;
    local_110 = &this->pf_value;
    local_108 = (vector<double,std::allocator<double>> *)&this->u_value;
    local_a8 = (vector<double,_std::allocator<double>_> *)(long)(int)((ulong)local_f8 >> 2);
    puVar18 = (undefined1 *)0x0;
    pvVar26 = local_e8;
    local_c0 = puVar27;
    local_b0 = pvVar11;
    do {
      piVar17 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar17) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar17;
      }
      lVar22 = *(long *)((long)pvVar26 + (long)puVar18 * 8);
      if (*(int *)(lVar22 + 0x7c) < 1) {
        pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        lVar36 = 0;
        do {
          iVar21 = *(int *)(*(long *)(lVar22 + 0x80) + lVar36 * 4);
          local_148.first = iVar21;
          local_138 = *(double *)(*(long *)(lVar22 + 0x98) + lVar36 * 8);
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar4,&local_148.first);
          }
          else {
            *iVar4._M_current = iVar21;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar14[local_148.first] = local_138;
          lVar36 = lVar36 + 1;
        } while (lVar36 < *(int *)(lVar22 + 0x7c));
      }
      pHVar37 = local_120;
      if (puVar18 != (undefined1 *)0x0) {
        puVar27 = (undefined1 *)0x0;
        do {
          iVar21 = pHVar37[(long)puVar27];
          local_148.first = iVar21;
          piVar17 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_138 = pdVar14[iVar21];
          iVar30 = piVar17[(long)(puVar27 + (long)local_a8)];
          lVar22 = (long)iVar30;
          iVar25 = piVar17[(long)(puVar27 +
                                 (long)((long)&(local_a8->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + 1))];
          if (iVar30 < iVar25) {
            do {
              local_138 = local_138 -
                          pdVar14[*(int *)(*(long *)local_e0 + lVar22 * 4)] *
                          (local_110->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar22];
              lVar22 = lVar22 + 1;
            } while (iVar25 != lVar22);
          }
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar4,&local_148.first);
            pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar4._M_current = iVar21;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          pdVar14[local_148.first] = local_138;
          puVar27 = puVar27 + 1;
        } while (puVar27 != puVar18);
      }
      iVar21 = pHVar37[(long)puVar18];
      local_60 = pdVar14[iVar21];
      pdVar14[iVar21] = 0.0;
      iVar21 = local_c8[(long)puVar18];
      lVar22 = (long)iVar21;
      piVar17 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar19 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar19 != piVar17) {
        uVar15 = 0;
        uVar28 = 1;
        do {
          local_13c = piVar17[uVar15];
          pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_148 = *(pair<int,_int> *)(pdVar14 + local_13c);
          pdVar14[local_13c] = 0.0;
          if (1e-14 < ABS((double)local_148)) {
            iVar4._M_current =
                 (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_128,iVar4,&local_13c);
            }
            else {
              *iVar4._M_current = local_13c;
              (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            iVar5._M_current =
                 (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_108,iVar5,(double *)&local_148);
            }
            else {
              *iVar5._M_current = (double)local_148;
              (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
          }
          piVar17 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar19 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar9 = uVar28 < (ulong)((long)piVar19 - (long)piVar17 >> 2);
          uVar15 = uVar28;
          uVar28 = (ulong)((int)uVar28 + 1);
        } while (bVar9);
      }
      pvVar35 = (vector<int,std::allocator<int>> *)
                ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      local_c8[(long)(puVar18 + 1)] = (int)pvVar35;
      *(double *)((long)local_d0 + (long)puVar18 * 8) =
           *(double *)((long)local_b8 + (long)puVar18 * 8) *
           *(double *)((long)local_48 + (long)puVar18 * 8);
      if (piVar19 != piVar17) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar17;
      }
      lVar36 = *(long *)((long)local_58 + (long)puVar18 * 8);
      local_a0 = puVar18;
      if (*(int *)(lVar36 + 0x7c) < 1) {
        pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        lVar32 = 0;
        do {
          iVar30 = *(int *)(*(long *)(lVar36 + 0x80) + lVar32 * 4);
          local_148.first = iVar30;
          local_138 = *(double *)(*(long *)(lVar36 + 0x98) + lVar32 * 8);
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar4,&local_148.first);
          }
          else {
            *iVar4._M_current = iVar30;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar14[local_148.first] = local_138;
          lVar32 = lVar32 + 1;
        } while (lVar32 < *(int *)(lVar36 + 0x7c));
      }
      puVar18 = local_a0;
      pHVar37 = local_120;
      local_68 = pvVar35;
      if (local_a0 != (undefined1 *)0x0) {
        puVar27 = (undefined1 *)0x0;
        do {
          lVar36 = (long)local_98[(long)puVar27].second;
          iVar30 = local_120[lVar36];
          uStack_f0 = 0;
          if ((1e-14 < ABS(pdVar14[iVar30])) &&
             (lVar32 = *(long *)((long)local_58 + lVar36 * 8), 0 < *(int *)(lVar32 + 0x7c))) {
            local_f8 = pdVar14[iVar30] * -*(double *)((long)local_b8 + lVar36 * 8);
            uStack_f0 = 0;
            lVar36 = 0;
            do {
              iVar25 = *(int *)(*(long *)(lVar32 + 0x80) + lVar36 * 4);
              local_148.first = iVar25;
              local_138 = *(double *)(*(long *)(lVar32 + 0x98) + lVar36 * 8);
              iVar4._M_current =
                   (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_118,iVar4,&local_148.first);
                pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                *iVar4._M_current = iVar25;
                (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              pdVar14[local_148.first] = local_138 * local_f8 + pdVar14[local_148.first];
              lVar36 = lVar36 + 1;
            } while (lVar36 < *(int *)(lVar32 + 0x7c));
          }
          puVar18 = local_a0;
          pHVar37 = local_120;
          pdVar14[iVar30] = 0.0;
          puVar27 = puVar27 + 1;
        } while (puVar27 != local_a0);
        uVar15 = local_70 & 0xffffffff;
        puVar27 = (undefined1 *)0x0;
        do {
          iVar30 = pHVar37[(long)puVar27];
          local_148.first = iVar30;
          local_138 = pdVar14[iVar30];
          uVar24 = local_c8[(long)(puVar27 + 1)];
          if ((int)uVar15 < (int)uVar24) {
            lVar36 = (long)(int)uVar15;
            do {
              local_138 = local_138 -
                          pdVar14[*(int *)(*(long *)local_128 + lVar36 * 4)] *
                          *(double *)(*(long *)local_108 + lVar36 * 8);
              lVar36 = lVar36 + 1;
            } while ((int)uVar24 != lVar36);
          }
          local_f8 = *(double *)((long)local_d0 + (long)puVar27 * 8);
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar4,&local_148.first);
            pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar4._M_current = iVar30;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          puVar27 = puVar27 + 1;
          pdVar14[local_148.first] = local_138 / local_f8;
          uVar15 = (ulong)uVar24;
        } while (puVar27 != puVar18);
      }
      pvVar11 = local_b0;
      dVar2 = 0.0;
      if (iVar21 < (int)local_68) {
        dVar2 = 0.0;
        do {
          dVar2 = dVar2 + pdVar14[*(int *)(*(long *)local_128 + lVar22 * 4)] *
                          *(double *)(*(long *)local_108 + lVar22 * 8);
          lVar22 = lVar22 + 1;
        } while ((int)local_68 != lVar22);
      }
      piVar34 = pHVar37 + (long)puVar18;
      local_f8 = *(double *)((long)local_b8 + (long)puVar18 * 8);
      uStack_f0 = 0;
      *(double *)((long)local_d0 + (long)puVar18 * 8) = dVar2 * local_f8 + local_60;
      pdVar14[*piVar34] = 0.0;
      piVar17 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar19 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar19 != piVar17) {
        local_f8 = -local_f8;
        uStack_f0 = 0x8000000000000000;
        uVar15 = 0;
        uVar28 = 1;
        do {
          local_13c = piVar17[uVar15];
          pdVar14 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_138 = pdVar14[local_13c];
          pdVar14[local_13c] = 0.0;
          uStack_130 = 0;
          if (1e-14 < ABS(local_138)) {
            iVar4._M_current =
                 (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_e0,iVar4,&local_13c);
            }
            else {
              *iVar4._M_current = local_13c;
              (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            local_148 = (pair<int,_int>)(local_138 * local_f8);
            iVar5._M_current =
                 (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (local_110,iVar5,(double *)&local_148);
            }
            else {
              *iVar5._M_current = (double)local_148;
              (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            piVar17 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar19 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          bVar9 = uVar28 < (ulong)((long)piVar19 - (long)piVar17 >> 2);
          uVar15 = uVar28;
          uVar28 = (ulong)((int)uVar28 + 1);
        } while (bVar9);
      }
      iVar4._M_current =
           (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_78,iVar4,piVar34);
      }
      else {
        *iVar4._M_current = *piVar34;
        (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pvVar26 = local_e8;
      iVar4._M_current =
           (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      iVar21 = (int)((ulong)((long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      this->u_total_x = (this->u_total_x - iVar4._M_current[-1]) + iVar21;
      local_148.first = iVar21;
      if (iVar4._M_current ==
          (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_d8,iVar4,&local_148.first);
      }
      else {
        *iVar4._M_current = iVar21;
        (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_148 = (pair<int,_int>)
                  ((long)puVar18 << 0x20 | (ulong)*(uint *)((long)pvVar11 + (long)puVar18 * 4));
      if (iStack_90._M_current == local_88) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_98,
                   iStack_90,&local_148);
      }
      else {
        *iStack_90._M_current = local_148;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      if (local_98 != iStack_90._M_current) {
        uVar15 = (long)iStack_90._M_current - (long)local_98 >> 3;
        iVar21 = 0;
        if (1 < uVar15) {
          iVar21 = 0;
          do {
            uVar15 = (long)uVar15 >> 1;
            iVar21 = iVar21 + 1;
          } while (1 < uVar15);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                  (local_98,iStack_90._M_current,iVar21,1);
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != local_c0);
    if (local_c0 != (undefined1 *)0x0) {
      local_e0 = (vector<int,std::allocator<int>> *)&this->ur_lastp;
      local_128 = (vector<int,std::allocator<int>> *)&this->ur_start;
      local_d8 = &this->ur_index;
      local_68 = (vector<int,std::allocator<int>> *)&this->u_start;
      local_78 = (vector<int,std::allocator<int>> *)&this->u_last_p;
      local_108 = (vector<double,std::allocator<double>> *)&this->ur_space;
      local_a8 = &this->ur_value;
      local_38 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
      local_40 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
      pvVar33 = (vector<double,_std::allocator<double>_> *)0x0;
      do {
        iVar21 = pHVar37[(long)pvVar33];
        local_148.first = iVar21;
        local_138 = (double)(long)*(int *)((long)pvVar11 + (long)pvVar33 * 4);
        piVar20 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar16 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        HVar31 = (piVar16[(long)local_138] - piVar20[(long)local_138]) + this->u_total_x;
        this->u_total_x = HVar31;
        lVar22 = (long)piVar16[(long)local_138];
        piVar17 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar19 = (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (piVar16[(long)local_138] < piVar20[(long)local_138]) {
          piVar6 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar14 = (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar30 = piVar7[piVar6[lVar22]];
            iVar25 = piVar17[iVar30];
            iVar3 = piVar19[iVar30];
            piVar19[iVar30] = iVar3 + -1;
            iVar30 = iVar25;
            if (iVar25 < iVar3) {
              piVar34 = piVar8 + iVar25;
              do {
                iVar30 = iVar25;
                if (*piVar34 == iVar21) break;
                iVar25 = iVar25 + 1;
                piVar34 = piVar34 + 1;
                iVar30 = iVar3;
              } while (iVar3 != iVar25);
            }
            piVar8[iVar30] = piVar8[(long)iVar3 + -1];
            pdVar14[iVar30] = pdVar14[(long)iVar3 + -1];
            lVar22 = lVar22 + 1;
          } while (lVar22 < piVar20[(long)local_138]);
          HVar31 = this->u_total_x;
        }
        iVar30 = (piVar17[(long)local_138] - piVar19[(long)local_138]) + HVar31;
        this->u_total_x = iVar30;
        lVar22 = (long)piVar17[(long)local_138];
        if (piVar17[(long)local_138] < piVar19[(long)local_138]) {
          piVar17 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar14 = (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar30 = piVar17[piVar6[lVar22]];
            iVar25 = piVar16[iVar30];
            iVar3 = piVar20[iVar30];
            piVar20[iVar30] = iVar3 + -1;
            iVar29 = iVar25;
            if (iVar25 < iVar3) {
              piVar34 = piVar7 + iVar25;
              do {
                pvVar11 = local_b0;
                iVar29 = iVar25;
                if (*piVar34 == iVar21) break;
                iVar25 = iVar25 + 1;
                piVar34 = piVar34 + 1;
                iVar29 = iVar3;
              } while (iVar3 != iVar25);
            }
            piVar34 = piVar8 + iVar30;
            *piVar34 = *piVar34 + 1;
            piVar7[iVar29] = piVar7[(long)iVar3 + -1];
            pdVar14[iVar29] = pdVar14[(long)iVar3 + -1];
            lVar22 = lVar22 + 1;
          } while (lVar22 < piVar19[(long)local_138]);
          iVar30 = this->u_total_x;
        }
        local_13c = (int)local_70;
        local_fc = local_c8[(long)((long)&(pvVar33->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data._M_start + 1)];
        local_60 = (double)CONCAT44(local_60._4_4_,local_fc);
        this->u_total_x = (local_fc - local_13c) + iVar30;
        local_110 = pvVar33;
        if (local_fc - local_13c != 0 && local_13c <= local_fc) {
          lVar36 = (long)local_13c;
          lVar22 = *(long *)local_108;
          do {
            lVar32 = (long)(this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar36]];
            iVar21 = *(int *)(lVar22 + lVar32 * 4);
            if (iVar21 == 0) {
              local_f8 = (double)(long)piVar16[lVar32];
              local_118 = (vector<int,std::allocator<int>> *)(long)piVar20[lVar32];
              uVar24 = piVar20[lVar32] - piVar16[lVar32];
              local_a0 = (undefined1 *)(ulong)uVar24;
              iVar21 = (int)((double)(int)uVar24 * 1.1 + 5.0);
              iVar30 = (int)((ulong)((long)(this->ur_index).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                    (long)(this->ur_index).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2);
              __new_size = (size_type)(iVar30 + iVar21);
              std::vector<int,_std::allocator<int>_>::resize(local_d8,__new_size);
              std::vector<double,_std::allocator<double>_>::resize(local_a8,__new_size);
              sVar23 = (long)local_118 * 4 + (long)local_f8 * -4;
              if (sVar23 != 0) {
                piVar17 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                memmove(piVar17 + iVar30,piVar17 + (long)local_f8,sVar23);
              }
              sVar23 = (long)local_118 * 8 + (long)local_f8 * -8;
              if (sVar23 != 0) {
                pdVar14 = (local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                memmove(pdVar14 + iVar30,pdVar14 + (long)local_f8,sVar23);
              }
              piVar16 = *(pointer *)local_128;
              piVar16[lVar32] = iVar30;
              piVar20 = *(pointer *)local_e0;
              piVar20[lVar32] = (int)local_a0 + iVar30;
              iVar21 = iVar21 - (int)local_a0;
              lVar22 = *(long *)local_108;
              *(int *)(lVar22 + lVar32 * 4) = iVar21;
              pvVar11 = local_b0;
            }
            *(int *)(lVar22 + lVar32 * 4) = iVar21 + -1;
            iVar21 = piVar20[lVar32];
            piVar20[lVar32] = iVar21 + 1;
            (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar21] = local_148.first;
            (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar21] =
                 (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar36 < local_fc);
        }
        iVar4._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_68,iVar4,&local_13c);
        }
        else {
          *iVar4._M_current = local_13c;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        puVar27 = local_c0;
        pvVar33 = local_110;
        pHVar37 = local_120;
        dVar2 = local_138;
        iVar4._M_current =
             (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_78,iVar4,&local_fc);
        }
        else {
          *iVar4._M_current = local_fc;
          (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        piVar17 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar4._M_current =
             (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_128,iVar4,piVar17 + (long)dVar2);
          piVar17 = *(pointer *)local_128;
        }
        else {
          *iVar4._M_current = piVar17[(long)dVar2];
          (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_e0,iVar4,piVar17 + (long)dVar2);
          local_4c = *(int *)(*(long *)local_128 + (long)dVar2 * 4);
        }
        else {
          local_4c = piVar17[(long)dVar2];
          *iVar4._M_current = local_4c;
          (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_4c = ((this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)dVar2] +
                   (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)dVar2]) - local_4c;
        iVar4._M_current =
             (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_108,iVar4,&local_4c);
        }
        else {
          *iVar4._M_current = local_4c;
          (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar17 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_148.first] =
             (int)((ulong)((long)iVar4._M_current - (long)piVar17) >> 2);
        piVar17[(long)dVar2] = -1;
        if (iVar4._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_38,iVar4,&local_148.first);
        }
        else {
          *iVar4._M_current = local_148.first;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        __args = (double *)((long)local_d0 + (long)pvVar33 * 8);
        iVar5._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_40,iVar5,__args);
        }
        else {
          *iVar5._M_current = *__args;
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        pvVar33 = (vector<double,_std::allocator<double>_> *)
                  ((long)&(pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1);
        local_70 = (ulong)local_60 & 0xffffffff;
      } while (pvVar33 != (vector<double,_std::allocator<double>_> *)puVar27);
    }
  }
  operator_delete__(local_e8);
  operator_delete__(local_58);
  operator_delete__(pvVar11);
  operator_delete__(local_b8);
  operator_delete__(local_48);
  operator_delete__(local_c8);
  operator_delete__(local_d0);
  if (local_98 != (pair<int,_int> *)0x0) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void HFactor::updateCFT(HVector* aq, HVector* ep, HighsInt* iRow
                        //, HighsInt* hint
) {
  /*
   * In the major update loop, the prefix
   *
   * c(p) = current working pivot
   * p(p) = previous pivot  (0 =< pp < cp)
   */

  HighsInt num_update = 0;
  for (HVector* vec = aq; vec != 0; vec = vec->next) num_update++;

  HVector** aq_work = new HVector*[num_update];
  HVector** ep_work = new HVector*[num_update];

  for (HighsInt i = 0; i < num_update; i++) {
    aq_work[i] = aq;
    ep_work[i] = ep;
    aq = aq->next;
    ep = ep->next;
  }

  // Pivot related buffers
  HighsInt pf_np0 = pf_pivot_index.size();
  HighsInt* p_logic = new HighsInt[num_update];
  double* p_value = new double[num_update];
  double* p_alpha = new double[num_update];
  for (HighsInt cp = 0; cp < num_update; cp++) {
    HighsInt c_row = iRow[cp];
    HighsInt i_logic = u_pivot_lookup[c_row];
    p_logic[cp] = i_logic;
    p_value[cp] = u_pivot_value[i_logic];
    p_alpha[cp] = aq_work[cp]->array[c_row];
  }

  // Temporary U pointers
  HighsInt* t_start = new HighsInt[num_update + 1];
  double* t_pivot = new double[num_update];
  t_start[0] = u_index.size();

  // Logically sorted previous row_ep
  vector<pair<HighsInt, int> > sorted_pp;

  // Major update loop
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Expand partial FTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < aq_work[cp]->packCount; i++) {
      HighsInt index = aq_work[cp]->packIndex[i];
      double value = aq_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 2. Update partial FTRAN result by recent FT matrix
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt p_row = iRow[pp];
      double value = dwork[p_row];
      HighsInt pf_pp = pp + pf_np0;
      for (HighsInt i = pf_start[pf_pp]; i < pf_start[pf_pp + 1]; i++)
        value -= dwork[pf_index[i]] * pf_value[i];
      iwork.push_back(p_row);  // OK to duplicate
      dwork[p_row] = value;
    }

    // 3. Store the partial FTRAN result to matrix U
    double ppaq = dwork[iRow[cp]];  // pivot of the partial aq
    dwork[iRow[cp]] = 0;
    HighsInt u_countX = t_start[cp];
    HighsInt u_startX = u_countX;
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;  // This effectively removes all duplication
      if (fabs(value) > kHighsTiny) {
        u_index.push_back(index);
        u_value.push_back(value);
      }
    }
    u_countX = u_index.size();
    t_start[cp + 1] = u_countX;
    t_pivot[cp] = p_value[cp] * p_alpha[cp];

    // 4. Expand partial BTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < ep_work[cp]->packCount; i++) {
      HighsInt index = ep_work[cp]->packIndex[i];
      double value = ep_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 5. Delete logical later rows (in logical order)
    for (HighsInt isort = 0; isort < cp; isort++) {
      HighsInt pp = sorted_pp[isort].second;
      HighsInt p_row = iRow[pp];
      double multiplier = -p_value[pp] * dwork[p_row];
      if (fabs(dwork[p_row]) > kHighsTiny) {
        for (HighsInt i = 0; i < ep_work[pp]->packCount; i++) {
          HighsInt index = ep_work[pp]->packIndex[i];
          double value = ep_work[pp]->packValue[i];
          iwork.push_back(index);
          dwork[index] += value * multiplier;
        }
      }
      dwork[p_row] = 0;  // Force to be 0
    }

    // 6. Update partial BTRAN result by recent U columns
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt kpivot = iRow[pp];
      double value = dwork[kpivot];
      for (HighsInt k = t_start[pp]; k < t_start[pp + 1]; k++)
        value -= dwork[u_index[k]] * u_value[k];
      value /= t_pivot[pp];
      iwork.push_back(kpivot);
      dwork[kpivot] = value;  // Again OK to duplicate
    }

    // 6.x compute current alpha
    double thex = 0;
    for (HighsInt k = u_startX; k < u_countX; k++) {
      HighsInt index = u_index[k];
      double value = u_value[k];
      thex += dwork[index] * value;
    }
    t_pivot[cp] = ppaq + thex * p_value[cp];

    // 7. Store BTRAN result to FT elimination, update logic helper
    dwork[iRow[cp]] = 0;
    double pivot_multiplier = -p_value[cp];
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;
      if (fabs(value) > kHighsTiny) {
        pf_index.push_back(index);
        pf_value.push_back(value * pivot_multiplier);
      }
    }
    pf_pivot_index.push_back(iRow[cp]);
    u_total_x += pf_index.size() - pf_start.back();
    pf_start.push_back(pf_index.size());

    // 8. Update the sorted ep
    sorted_pp.push_back(make_pair(p_logic[cp], cp));
    pdqsort(sorted_pp.begin(), sorted_pp.end());
  }

  // Now modify the U matrix
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Delete pivotal row from U
    HighsInt cIndex = iRow[cp];
    HighsInt cLogic = p_logic[cp];
    u_total_x -= ur_lastp[cLogic] - ur_start[cLogic];
    for (HighsInt k = ur_start[cLogic]; k < ur_lastp[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[ur_index[k]];
      HighsInt i_find = u_start[i_logic];
      HighsInt i_last = --u_last_p[i_logic];
      for (; i_find <= i_last; i_find++)
        if (u_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      u_index[i_find] = u_index[i_last];
      u_value[i_find] = u_value[i_last];
    }

    // 2. Delete pivotal column from UR
    u_total_x -= u_last_p[cLogic] - u_start[cLogic];
    for (HighsInt k = u_start[cLogic]; k < u_last_p[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[u_index[k]];
      HighsInt i_find = ur_start[i_logic];
      HighsInt i_last = --ur_lastp[i_logic];
      for (; i_find <= i_last; i_find++)
        if (ur_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      ur_space[i_logic]++;
      ur_index[i_find] = ur_index[i_last];
      ur_value[i_find] = ur_value[i_last];
    }

    // 3. Insert the (stored) partial FTRAN to the row matrix
    HighsInt u_startX = t_start[cp];
    HighsInt u_endX = t_start[cp + 1];
    u_total_x += u_endX - u_startX;
    // Store column as UR elements
    for (HighsInt k = u_startX; k < u_endX; k++) {
      // Which ETA file
      HighsInt i_logic = u_pivot_lookup[u_index[k]];

      // Move row to the end if necessary
      if (ur_space[i_logic] == 0) {
        // Make pointers
        HighsInt row_start = ur_start[i_logic];
        HighsInt row_count = ur_lastp[i_logic] - row_start;
        HighsInt new_start = ur_index.size();
        HighsInt new_space = row_count * 1.1 + 5;

        // Check matrix UR
        ur_index.resize(new_start + new_space);
        ur_value.resize(new_start + new_space);

        // Move elements
        HighsInt i_from = row_start;
        HighsInt i_end = row_start + row_count;
        HighsInt i_to = new_start;
        copy(&ur_index[i_from], &ur_index[i_end], &ur_index[i_to]);
        copy(&ur_value[i_from], &ur_value[i_end], &ur_value[i_to]);

        // Save new pointers
        ur_start[i_logic] = new_start;
        ur_lastp[i_logic] = new_start + row_count;
        ur_space[i_logic] = new_space - row_count;
      }

      // Put into the next available space
      ur_space[i_logic]--;
      HighsInt i_put = ur_lastp[i_logic]++;
      ur_index[i_put] = cIndex;
      ur_value[i_put] = u_value[k];
    }

    // 4. Save pointers
    u_start.push_back(u_startX);
    u_last_p.push_back(u_endX);

    ur_start.push_back(ur_start[cLogic]);
    ur_lastp.push_back(ur_start[cLogic]);
    ur_space.push_back(ur_space[cLogic] + ur_lastp[cLogic] - ur_start[cLogic]);

    u_pivot_lookup[cIndex] = u_pivot_index.size();
    u_pivot_index[cLogic] = -1;
    u_pivot_index.push_back(cIndex);
    u_pivot_value.push_back(t_pivot[cp]);
  }

  //    // See if we want refactor
  //    if (u_total_x > u_merit_x && pf_pivot_index.size() > 100)
  //        *hint = 1;
  delete[] aq_work;
  delete[] ep_work;
  delete[] p_logic;
  delete[] p_value;
  delete[] p_alpha;
  delete[] t_start;
  delete[] t_pivot;
}